

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasLazyFields(FileDescriptor *file,Options *options)

{
  long lVar1;
  once_flag *__once;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  bVar3 = 0 < *(int *)(file + 0x2c);
  if (0 < *(int *)(file + 0x2c)) {
    bVar2 = HasLazyFields(*(Descriptor **)(file + 0x68),options);
    if (!bVar2) {
      lVar4 = 0;
      lVar5 = 0x90;
      do {
        lVar4 = lVar4 + 1;
        bVar3 = lVar4 < *(int *)(file + 0x2c);
        if (*(int *)(file + 0x2c) <= lVar4) goto LAB_0022fa0f;
        bVar2 = HasLazyFields((Descriptor *)(lVar5 + *(long *)(file + 0x68)),options);
        lVar5 = lVar5 + 0x90;
      } while (!bVar2);
    }
    if (bVar3) {
      return true;
    }
  }
LAB_0022fa0f:
  bVar3 = 0 < *(int *)(file + 0x38);
  if (0 < *(int *)(file + 0x38)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(file + 0x80);
      if ((*(char *)(*(long *)(lVar1 + 0x78 + lVar5) + 0x4d) == '\x01') &&
         (*(int *)(lVar1 + 0x3c + lVar5) != 3)) {
        __once = *(once_flag **)(lVar1 + 0x30 + lVar5);
        if (__once != (once_flag *)0x0) {
          local_40 = (FieldDescriptor *)(lVar1 + lVar5);
          local_38 = FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (__once,&local_38,&local_40);
        }
        if (*(int *)(lVar1 + 0x38 + lVar5) == 0xb) {
          if (options->enforce_mode == kSpeed) {
            if (options->opensource_runtime != true) {
              return bVar3;
            }
          }
          else if (((options->enforce_mode != kLiteRuntime) &&
                   (*(int *)(*(long *)(*(long *)(lVar1 + 0x28 + lVar5) + 0x88) + 0xa4) != 3)) &&
                  ((options->opensource_runtime & 1U) == 0)) {
            return bVar3;
          }
        }
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x98;
      bVar3 = lVar4 < *(int *)(file + 0x38);
    } while (lVar4 < *(int *)(file + 0x38));
  }
  return bVar3;
}

Assistant:

bool HasLazyFields(const FileDescriptor* file, const Options& options) {
  for (int i = 0; i < file->message_type_count(); i++) {
    const Descriptor* descriptor(file->message_type(i));
    if (HasLazyFields(descriptor, options)) {
      return true;
    }
  }
  for (int field_idx = 0; field_idx < file->extension_count(); field_idx++) {
    if (IsLazy(file->extension(field_idx), options)) {
      return true;
    }
  }
  return false;
}